

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

FunctionPrototypeSyntax * __thiscall
slang::parsing::Parser::parseFunctionPrototype
          (Parser *this,SyntaxKind parentKind,
          bitmask<slang::parsing::detail::FunctionOptions> options,bool *isConstructor)

{
  SyntaxKind SVar1;
  SyntaxNode *pSVar2;
  bool bVar3;
  ImplicitTypeSyntax *this_00;
  SyntaxNode *this_01;
  SourceLocation SVar4;
  Diagnostic *pDVar5;
  FunctionPortListSyntax *portList;
  FunctionPrototypeSyntax *pFVar6;
  byte bVar7;
  DiagCode code;
  ScopedNameSyntax *scoped;
  span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL> sVar8;
  SourceRange SVar9;
  Token TVar10;
  Token local_b0;
  SyntaxKind local_a0;
  uint32_t index;
  Token lifetime;
  pointer local_88;
  __extent_storage<18446744073709551615UL> local_80;
  SyntaxList<slang::syntax::ClassSpecifierSyntax> local_78;
  Token local_40;
  
  local_a0 = parentKind;
  Token::Token(&local_b0);
  bVar3 = ParserBase::peek(&this->super_ParserBase,TaskKeyword);
  if (bVar3) {
    local_b0 = ParserBase::consume(&this->super_ParserBase);
  }
  else {
    local_b0 = ParserBase::expect(&this->super_ParserBase,FunctionKeyword);
  }
  sVar8 = parseClassSpecifierList(this,SUB41((options.m_bits & 8) >> 3,0));
  lifetime = parseLifetime(this);
  bVar7 = (byte)((options.m_bits & 2) >> 1);
  if ((bVar7 & lifetime.info != (Info *)0x0) == 1) {
    SVar9 = Token::range(&lifetime);
    ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xc60005,SVar9);
  }
  index = 0;
  bVar3 = scanQualifiedName(this,&index,true);
  if ((bVar3) &&
     (TVar10 = ParserBase::peek(&this->super_ParserBase,index), (TVar10._0_4_ & 0xfffd) == 0x11)) {
    Token::Token(&local_40);
    local_78.super_SyntaxListBase.super_SyntaxNode.kind = 1;
    local_78.super_span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL>._M_extent.
    _M_extent_value = 0;
    local_78.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
    local_78.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
    local_78.super_SyntaxListBase.childCount = 0;
    local_78.super_span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL>._M_ptr =
         (pointer)0x0;
    local_78.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_0057b228;
    TVar10 = ParserBase::placeholderToken(&this->super_ParserBase);
    this_00 = slang::syntax::SyntaxFactory::implicitType
                        (&this->factory,local_40,
                         (SyntaxList<slang::syntax::VariableDimensionSyntax> *)&local_78,TVar10);
  }
  else {
    this_00 = (ImplicitTypeSyntax *)
              parseDataType(this,(bitmask<slang::parsing::detail::TypeOptions>)0x3);
  }
  this_01 = (SyntaxNode *)parseName(this);
  SVar1 = this_01->kind;
  bVar3 = false;
  if ((SVar1 == ConstructorName) || (bVar3 = false, SVar1 == IdentifierName)) {
LAB_002d2047:
    if (((lifetime.kind == StaticKeyword & bVar3) == 1) && (*(short *)&this_01[1].parent == 0x17)) {
      SVar9 = Token::range(&lifetime);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x7c0005,SVar9);
    }
  }
  else {
    if ((SVar1 == ScopedName) &&
       ((**(int **)(this_01 + 1) == 0xe5 || (**(int **)(this_01 + 1) == 0x67)))) {
      bVar3 = true;
      if ((**(int **)(this_01 + 2) != 0x67) && (**(int **)(this_01 + 2) != 0xe5)) goto LAB_002d1fd8;
    }
    else {
LAB_002d1fd8:
      SVar4 = Token::location(&local_b0);
      pDVar5 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x540005,SVar4);
      SVar9 = slang::syntax::SyntaxNode::sourceRange(this_01);
      Diagnostic::operator<<(pDVar5,SVar9);
      bVar3 = this_01->kind == ScopedName;
    }
    if ((bVar7 & bVar3) != 1) goto LAB_002d2047;
    local_78.super_SyntaxListBase._0_16_ = slang::syntax::SyntaxNode::getFirstToken(this_01);
    SVar4 = Token::location((Token *)&local_78);
    ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xa50005,SVar4);
  }
  TVar10 = ParserBase::getLastConsumed(&this->super_ParserBase);
  if (isConstructor != (bool *)0x0) {
    *isConstructor = TVar10.kind == NewKeyword;
  }
  bVar7 = (byte)options.m_bits;
  local_88 = (pointer)sVar8._M_ptr;
  local_80 = sVar8._M_extent._M_extent_value;
  if (TVar10.kind == NewKeyword) {
    options.m_bits = options.m_bits | 4;
    SVar1 = (this_00->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.kind;
    if (local_b0.kind == TaskKeyword) {
      if (SVar1 != ImplicitType) goto LAB_002d219d;
      SVar4 = Token::location(&local_b0);
      code.subsystem = Parser;
      code.code = 0xa7;
LAB_002d2126:
      pDVar5 = ParserBase::addDiag(&this->super_ParserBase,code,SVar4);
    }
    else {
      if (SVar1 != ImplicitType) {
        local_78.super_SyntaxListBase._0_16_ = slang::syntax::SyntaxNode::getFirstToken(this_01);
        SVar4 = Token::location((Token *)&local_78);
        pDVar5 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x110005,SVar4);
        SVar9 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)this_00);
        Diagnostic::operator<<(pDVar5,SVar9);
        goto LAB_002d2215;
      }
      if ((local_a0 != ClassDeclaration) && (this_01->kind != ScopedName)) {
        SVar4 = Token::location(&local_b0);
        code.subsystem = Parser;
        code.code = 0x10;
        goto LAB_002d2126;
      }
      if ((local_80._M_extent_value != 0 & bVar7 >> 3) != 1) goto LAB_002d2215;
      SVar9 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)*local_88);
      pDVar5 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xa30005,SVar9);
    }
    SVar9 = slang::syntax::SyntaxNode::sourceRange(this_01);
    Diagnostic::operator<<(pDVar5,SVar9);
  }
  else {
    if (local_b0.kind != TaskKeyword) {
      if (((options.m_bits & 1) == 0) &&
         ((this_00->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.kind ==
          ImplicitType)) {
        local_78.super_SyntaxListBase._0_16_ = slang::syntax::SyntaxNode::getFirstToken(this_01);
        SVar4 = Token::location((Token *)&local_78);
        ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x610005,SVar4);
      }
      goto LAB_002d2215;
    }
    if ((this_00->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.kind == ImplicitType
       ) goto LAB_002d2215;
LAB_002d219d:
    SVar4 = Token::location(&local_b0);
    pDVar5 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xa80005,SVar4);
    SVar9 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)this_00);
    Diagnostic::operator<<(pDVar5,SVar9);
  }
LAB_002d2215:
  pSVar2 = this->previewNode;
  this->previewNode = (SyntaxNode *)0x0;
  portList = parseFunctionPortList(this,options);
  this->previewNode = pSVar2;
  local_78.super_SyntaxListBase.super_SyntaxNode.kind = 1;
  local_78.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_78.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_78.super_SyntaxListBase.childCount = local_80._M_extent_value;
  local_78.super_span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL>._M_ptr =
       (pointer)local_88;
  local_78.super_span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = local_80._M_extent_value;
  local_78.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_0057e4a8;
  pFVar6 = slang::syntax::SyntaxFactory::functionPrototype
                     (&this->factory,local_b0,&local_78,lifetime,&this_00->super_DataTypeSyntax,
                      (NameSyntax *)this_01,portList);
  return pFVar6;
}

Assistant:

FunctionPrototypeSyntax& Parser::parseFunctionPrototype(SyntaxKind parentKind,
                                                        bitmask<FunctionOptions> options,
                                                        bool* isConstructor) {
    Token keyword;
    if (peek(TokenKind::TaskKeyword))
        keyword = consume();
    else
        keyword = expect(TokenKind::FunctionKeyword);

    const bool allowSpecifiers = options.has(FunctionOptions::AllowOverrideSpecifiers);
    auto specifiers = parseClassSpecifierList(allowSpecifiers);

    auto lifetime = parseLifetime();
    if (lifetime && options.has(FunctionOptions::IsPrototype))
        addDiag(diag::LifetimeForPrototype, lifetime.range());

    // Return type is optional for function declarations, and should not be given
    // for tasks and constructors (we'll check that below).
    DataTypeSyntax* returnType = nullptr;
    uint32_t index = 0;
    if (!scanQualifiedName(index, /* allowNew */ true))
        returnType = &parseDataType(TypeOptions::AllowImplicit | TypeOptions::AllowVoid);
    else {
        auto next = peek(index);
        if (next.kind != TokenKind::Semicolon && next.kind != TokenKind::OpenParenthesis)
            returnType = &parseDataType(TypeOptions::AllowImplicit | TypeOptions::AllowVoid);
        else
            returnType = &factory.implicitType(Token(), nullptr, placeholderToken());
    }

    auto& name = parseName();
    if (!checkSubroutineName(name))
        addDiag(diag::ExpectedSubroutineName, keyword.location()) << name.sourceRange();

    if (options.has(FunctionOptions::IsPrototype) && name.kind == SyntaxKind::ScopedName) {
        addDiag(diag::SubroutinePrototypeScoped, name.getFirstToken().location());
    }
    else if (lifetime.kind == TokenKind::StaticKeyword && name.kind == SyntaxKind::ScopedName &&
             name.as<ScopedNameSyntax>().separator.kind == TokenKind::DoubleColon) {
        addDiag(diag::MethodStaticLifetime, lifetime.range());
    }

    bool constructor = getLastConsumed().kind == TokenKind::NewKeyword;
    if (isConstructor)
        *isConstructor = constructor;

    if (constructor)
        options |= FunctionOptions::AllowDefaultArg;

    if (keyword.kind == TokenKind::TaskKeyword) {
        if (returnType->kind != SyntaxKind::ImplicitType)
            addDiag(diag::TaskReturnType, keyword.location()) << returnType->sourceRange();
        else if (constructor)
            addDiag(diag::TaskConstructor, keyword.location()) << name.sourceRange();
    }
    else if (constructor) {
        if (returnType->kind != SyntaxKind::ImplicitType) {
            addDiag(diag::ConstructorReturnType, name.getFirstToken().location())
                << returnType->sourceRange();
        }
        else if (name.kind != SyntaxKind::ScopedName &&
                 parentKind != SyntaxKind::ClassDeclaration) {
            addDiag(diag::ConstructorOutsideClass, keyword.location()) << name.sourceRange();
        }
        else if (allowSpecifiers && !specifiers.empty()) {
            addDiag(diag::SpecifiersNotAllowed, specifiers[0]->sourceRange()) << name.sourceRange();
        }
    }
    else if (!options.has(FunctionOptions::AllowImplicitReturn) &&
             returnType->kind == SyntaxKind::ImplicitType) {
        addDiag(diag::ImplicitNotAllowed, name.getFirstToken().location());
    }

    // If the function returns a declared enum type, save it off here
    // so that we don't suck it into the port list.
    auto savedPN = std::exchange(previewNode, nullptr);
    auto portList = parseFunctionPortList(options);
    previewNode = savedPN;

    return factory.functionPrototype(keyword, specifiers, lifetime, *returnType, name, portList);
}